

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_log_module.c
# Opt level: O1

void ngx_stream_log_write(ngx_stream_session_t *s,ngx_stream_log_t *log,u_char *buf,size_t len)

{
  int err;
  ngx_stream_log_script_t *pnVar1;
  ngx_log_t *pnVar2;
  void *pvVar3;
  ngx_open_file_t *pnVar4;
  long lVar5;
  u_char *puVar6;
  ngx_int_t nVar7;
  int *piVar8;
  size_t sVar9;
  ngx_fd_t __fd;
  u_char *puVar10;
  ngx_open_file_info_t local_a8;
  undefined1 local_40 [8];
  ngx_str_t log_1;
  
  pnVar1 = log->script;
  if (pnVar1 == (ngx_stream_log_script_t *)0x0) {
    pnVar4 = log->file;
    puVar10 = (pnVar4->name).data;
    if ((pnVar4->data != (void *)0x0) && (lVar5 = *(long *)((long)pnVar4->data + 0x28), lVar5 != 0))
    {
      sVar9 = ngx_stream_log_gzip(pnVar4->fd,buf,len,lVar5,s->connection->log);
      goto LAB_0018c42f;
    }
    __fd = pnVar4->fd;
  }
  else {
    puVar6 = ngx_stream_script_run
                       (s,(ngx_str_t *)local_40,pnVar1->lengths->elts,1,pnVar1->values->elts);
    puVar10 = (u_char *)log_1.len;
    sVar9 = len;
    if (puVar6 == (u_char *)0x0) {
      puVar10 = (u_char *)0x0;
      goto LAB_0018c42f;
    }
    *(undefined1 *)((log_1.len - 1) + (long)local_40) = 0;
    pnVar2 = s->connection->log;
    if ((pnVar2->log_level & 0x400) != 0) {
      ngx_log_error_core(8,pnVar2,0,"stream log \"%s\"",log_1.len);
    }
    pvVar3 = s->srv_conf[ngx_stream_log_module.ctx_index];
    local_a8._0_8_ = 0;
    local_a8.uniq = 0;
    local_a8.mtime = 0;
    local_a8.size = 0;
    local_a8.fs_size = 0;
    local_a8.read_ahead = 0;
    local_a8.err = 0;
    local_a8._60_4_ = 0;
    local_a8.failed = (char *)0x0;
    local_a8.disable_symlinks_from = 0;
    local_a8._96_8_ = 0x10;
    local_a8.valid = *(time_t *)((long)pvVar3 + 0x10);
    local_a8.min_uses = *(ngx_uint_t *)((long)pvVar3 + 0x18);
    local_a8.directio = 0x7fffffffffffffff;
    nVar7 = ngx_open_cached_file
                      (*(ngx_open_file_cache_t **)((long)pvVar3 + 8),(ngx_str_t *)local_40,&local_a8
                       ,s->connection->pool);
    if (nVar7 != 0) {
      if ((local_a8.err != 0) && (pnVar2 = s->connection->log, 2 < pnVar2->log_level)) {
        piVar8 = __errno_location();
        ngx_log_error_core(3,pnVar2,*piVar8,"%s \"%s\" failed",local_a8.failed,log_1.len);
      }
      goto LAB_0018c42f;
    }
    pnVar2 = s->connection->log;
    if ((pnVar2->log_level & 0x400) != 0) {
      ngx_log_error_core(8,pnVar2,0,"stream log #%d",local_a8._0_8_ & 0xffffffff);
    }
    __fd = local_a8.fd;
  }
  sVar9 = write(__fd,buf,len);
LAB_0018c42f:
  if (sVar9 != len) {
    lVar5 = ngx_cached_time->sec;
    if (sVar9 == 0xffffffffffffffff) {
      piVar8 = __errno_location();
      err = *piVar8;
      if (err == 0x1c) {
        log->disk_full_time = lVar5;
      }
      if (lVar5 - log->error_log_time < 0x3c) {
        return;
      }
      pnVar2 = s->connection->log;
      if (1 < pnVar2->log_level) {
        ngx_log_error_core(2,pnVar2,err,"write() to \"%s\" failed",puVar10);
      }
    }
    else {
      if (lVar5 - log->error_log_time < 0x3c) {
        return;
      }
      pnVar2 = s->connection->log;
      if (1 < pnVar2->log_level) {
        ngx_log_error_core(2,pnVar2,0,"write() to \"%s\" was incomplete: %z of %uz",puVar10,sVar9,
                           len);
      }
    }
    log->error_log_time = lVar5;
  }
  return;
}

Assistant:

static void
ngx_stream_log_write(ngx_stream_session_t *s, ngx_stream_log_t *log,
    u_char *buf, size_t len)
{
    u_char                *name;
    time_t                 now;
    ssize_t                n;
    ngx_err_t              err;
#if (NGX_ZLIB)
    ngx_stream_log_buf_t  *buffer;
#endif

    if (log->script == NULL) {
        name = log->file->name.data;

#if (NGX_ZLIB)
        buffer = log->file->data;

        if (buffer && buffer->gzip) {
            n = ngx_stream_log_gzip(log->file->fd, buf, len, buffer->gzip,
                                    s->connection->log);
        } else {
            n = ngx_write_fd(log->file->fd, buf, len);
        }
#else
        n = ngx_write_fd(log->file->fd, buf, len);
#endif

    } else {
        name = NULL;
        n = ngx_stream_log_script_write(s, log->script, &name, buf, len);
    }

    if (n == (ssize_t) len) {
        return;
    }

    now = ngx_time();

    if (n == -1) {
        err = ngx_errno;

        if (err == NGX_ENOSPC) {
            log->disk_full_time = now;
        }

        if (now - log->error_log_time > 59) {
            ngx_log_error(NGX_LOG_ALERT, s->connection->log, err,
                          ngx_write_fd_n " to \"%s\" failed", name);

            log->error_log_time = now;
        }

        return;
    }

    if (now - log->error_log_time > 59) {
        ngx_log_error(NGX_LOG_ALERT, s->connection->log, 0,
                      ngx_write_fd_n " to \"%s\" was incomplete: %z of %uz",
                      name, n, len);

        log->error_log_time = now;
    }
}